

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_cvtpw_ps_mips(CPUMIPSState *env,uint64_t fdt0)

{
  uint uVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  int excph;
  int excp;
  uint32_t wth2;
  uint32_t wt2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  excp = float32_to_int32_mips((float32)fdt0,&(env->active_fpu).fp_status);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if ((uVar1 & 9) != 0) {
    excp = 0x7fffffff;
  }
  set_float_exception_flags(0,&(env->active_fpu).fp_status);
  excph = float32_to_int32_mips((float32)(fdt0 >> 0x20),&(env->active_fpu).fp_status);
  uVar2 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if ((uVar2 & 9) != 0) {
    excph = 0x7fffffff;
  }
  set_float_exception_flags(uVar1 | uVar2,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(excph,excp);
}

Assistant:

uint64_t helper_float_cvtpw_ps(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;
    uint32_t wth2;
    int excp, excph;

    wt2 = float32_to_int32(fdt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    excp = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excp & (float_flag_overflow | float_flag_invalid)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(0, &env->active_fpu.fp_status);
    wth2 = float32_to_int32(fdt0 >> 32, &env->active_fpu.fp_status);
    excph = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excph & (float_flag_overflow | float_flag_invalid)) {
        wth2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(excp | excph, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());

    return ((uint64_t)wth2 << 32) | wt2;
}